

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

int Sfm_NodeReadUsed(Sfm_Ntk_t *p,int i)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Sfm_ObjFaninNum(p,i);
  if (iVar1 < 1) {
    iVar1 = Sfm_ObjFanoutNum(p,i);
    uVar2 = (uint)(0 < iVar1);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int Sfm_NodeReadUsed( Sfm_Ntk_t * p, int i )
{
    return (Sfm_ObjFaninNum(p, i) > 0) || (Sfm_ObjFanoutNum(p, i) > 0);
}